

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_11::ScanLineProcess::run_decode
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,int fbY,
          int fbLastY,vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *filllist)

{
  exr_result_t eVar1;
  undefined8 uVar2;
  IoExc *this_00;
  char *text;
  byte bVar3;
  exr_const_context_t in_RDI;
  vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *in_stack_00000008;
  int in_stack_00000014;
  FrameBuffer *in_stack_00000018;
  ScanLineProcess *in_stack_00000020;
  exr_decode_pipeline_t *in_stack_00000030;
  int in_stack_0000003c;
  bool isfirst;
  exr_decode_pipeline_t *in_stack_000001a0;
  exr_chunk_info_t *in_stack_000001a8;
  int in_stack_000001b4;
  exr_const_context_t in_stack_000001b8;
  char *in_stack_ffffffffffffff98;
  exr_decode_pipeline_t *in_stack_ffffffffffffffa0;
  exr_decode_pipeline_t *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int iVar4;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  FrameBuffer *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  in_RDI->mode = '!';
  in_RDI->version = '\0';
  in_RDI->max_name_length = '\0';
  in_RDI->is_singlepart_tiled = '\0';
  bVar3 = in_RDI->has_nonimage_data & 1;
  if ((in_RDI->has_nonimage_data & 1) == 0) {
    eVar1 = exr_decoding_update(in_RDI,iVar4,(exr_chunk_info_t *)in_stack_ffffffffffffffa8,
                                in_stack_ffffffffffffffa0);
    if (eVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::IoExc::IoExc((IoExc *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      __cxa_throw(uVar2,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
    }
  }
  else {
    eVar1 = exr_decoding_initialize
                      (in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
    if (eVar1 != 0) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::IoExc::IoExc((IoExc *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      __cxa_throw(uVar2,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
    }
    in_RDI->has_nonimage_data = '\0';
  }
  update_pointers((ScanLineProcess *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (((bVar3 & 1) != 0) &&
     (eVar1 = exr_decoding_choose_default_routines
                        ((exr_const_context_t)CONCAT44(fbY,fbLastY),in_stack_0000003c,
                         in_stack_00000030), eVar1 != 0)) {
    this_00 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::IoExc::IoExc(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
  }
  eVar1 = exr_decoding_run(in_RDI,iVar4,in_stack_ffffffffffffffa8);
  in_RDI->mode = (char)eVar1;
  in_RDI->version = (char)((uint)eVar1 >> 8);
  in_RDI->max_name_length = (char)((uint)eVar1 >> 0x10);
  in_RDI->is_singlepart_tiled = (char)((uint)eVar1 >> 0x18);
  iVar4._0_1_ = in_RDI->mode;
  iVar4._1_1_ = in_RDI->version;
  iVar4._2_1_ = in_RDI->max_name_length;
  iVar4._3_1_ = in_RDI->is_singlepart_tiled;
  if (iVar4 == 0) {
    run_fill(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008);
    return;
  }
  text = (char *)__cxa_allocate_exception(0x48);
  Iex_3_3::IoExc::IoExc((IoExc *)in_stack_ffffffffffffffa0,text);
  __cxa_throw(text,&Iex_3_3::IoExc::typeinfo,Iex_3_3::IoExc::~IoExc);
}

Assistant:

void ScanLineProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    int fbY,
    int fbLastY,
    const std::vector<Slice> &filllist)
{
    last_decode_err = EXR_ERR_UNKNOWN;
    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    update_pointers (outfb, fbY, fbLastY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, fbY, filllist);
}